

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * ReadFile_abi_cxx11_(CStringRef name)

{
  bool bVar1;
  char *pcVar2;
  string *in_RDI;
  char buffer [4096];
  ifstream ifs;
  string *data;
  undefined1 local_1238 [4120];
  long local_220 [65];
  byte local_11;
  BasicCStringRef<char> local_10 [2];
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  pcVar2 = fmt::BasicCStringRef<char>::c_str(local_10);
  std::ifstream::ifstream(local_220,pcVar2,8);
  do {
    std::istream::read((char *)local_220,(long)local_1238);
    std::istream::gcount();
    std::__cxx11::string::append((char *)in_RDI,(ulong)local_1238);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  } while (bVar1);
  local_11 = 1;
  std::ifstream::~ifstream(local_220);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string ReadFile(fmt::CStringRef name) {
  std::string data;
  std::ifstream ifs(name.c_str());
  enum { BUFFER_SIZE = 4096 };
  char buffer[BUFFER_SIZE];
  do {
    ifs.read(buffer, BUFFER_SIZE);
    data.append(buffer, static_cast<std::string::size_type>(ifs.gcount()));
  } while (ifs);
  return data;
}